

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexem.cpp
# Opt level: O2

int __thiscall Hpipe::Lexem::display_dot(Lexem *this,char *f,char *prg)

{
  int iVar1;
  StreamSep *pSVar2;
  int iVar3;
  allocator local_401;
  string local_400;
  char *local_3e0;
  char *local_3d8;
  string local_3d0;
  string local_3b0;
  undefined1 local_390 [72];
  StreamSepMaker os;
  StreamSep local_2c0;
  StreamSep local_278;
  ofstream of;
  
  local_3d8 = f;
  std::ofstream::ofstream(&of,f,_S_out);
  local_390._0_8_ = local_390 + 0x10;
  local_390._8_8_ = (pointer)0x0;
  local_390[0x10] = '\0';
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  local_400._M_string_length = 0;
  local_400.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_3d0,"\n",&local_401);
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  local_3b0._M_string_length = 0;
  local_3b0.field_2._M_local_buf[0] = '\0';
  StreamSepMaker::StreamSepMaker(&os,(TS *)&of,(string *)local_390,&local_400,&local_3d0,&local_3b0)
  ;
  local_3e0 = prg;
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)local_390);
  StreamSepMaker::operator<<(&local_278,&os,(char (*) [21])"digraph LexemMaker {");
  StreamSep::~StreamSep(&local_278);
  iVar3 = 0;
  iVar1 = write_dot(this,&os,0);
  while (local_400._M_dataplus._M_p._0_4_ = iVar3, iVar3 <= iVar1) {
    StreamSepMaker::operator<<((StreamSep *)local_390,&os,(char (*) [3])0x1762f6);
    pSVar2 = StreamSep::operator<<((StreamSep *)local_390,(int *)&local_400);
    StreamSep::operator<<(pSVar2,(char (*) [22])" [ shape=plaintext ];");
    StreamSep::~StreamSep((StreamSep *)local_390);
    iVar3 = 1;
    if ((int)local_400._M_dataplus._M_p != 0) {
      StreamSepMaker::operator<<((StreamSep *)local_390,&os,(char (*) [3])0x1762f6);
      local_3d0._M_dataplus._M_p._0_4_ = (int)local_400._M_dataplus._M_p + -1;
      pSVar2 = StreamSep::operator<<((StreamSep *)local_390,(int *)&local_3d0);
      pSVar2 = StreamSep::operator<<(pSVar2,(char (*) [5])0x177b27);
      pSVar2 = StreamSep::operator<<(pSVar2,(int *)&local_400);
      StreamSep::operator<<(pSVar2,(char (*) [2])0x1775c3);
      StreamSep::~StreamSep((StreamSep *)local_390);
      iVar3 = (int)local_400._M_dataplus._M_p + 1;
    }
  }
  StreamSepMaker::operator<<(&local_2c0,&os,(char (*) [2])0x178092);
  StreamSep::~StreamSep(&local_2c0);
  std::ofstream::close();
  iVar3 = exec_dot(local_3d8,local_3e0,true,true);
  StreamSepMaker::~StreamSepMaker(&os);
  std::ofstream::~ofstream(&of);
  return iVar3;
}

Assistant:

int Lexem::display_dot( const char *f, const char *prg ) const {
    std::ofstream of( f );
    StreamSepMaker os( of );
    os << "digraph LexemMaker {";

    int m = write_dot( os, 0 );

    for( int i = 0; i <= m; ++i ) {
        os << "  " << i << " [ shape=plaintext ];";
        if ( i )
            os << "  " << i - 1 << " -> " << i << ";";
    }

    os << "}";
    of.close();

    return exec_dot( f, prg );
}